

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANAplanner.cpp
# Opt level: O0

int __thiscall
anaPlanner::ComputeHeuristic
          (anaPlanner *this,CMDPSTATE *MDPstate,anaSearchStateSpace_t *pSearchStateSpace)

{
  undefined4 *in_RSI;
  long in_RDI;
  int retv;
  undefined4 local_4;
  
  if ((*(byte *)(in_RDI + 0x20) & 1) == 0) {
    local_4 = (**(code **)(**(long **)(in_RDI + 8) + 0x20))(*(long **)(in_RDI + 8),*in_RSI);
  }
  else {
    local_4 = (**(code **)(**(long **)(in_RDI + 8) + 0x18))(*(long **)(in_RDI + 8),*in_RSI);
  }
  return local_4;
}

Assistant:

int anaPlanner::ComputeHeuristic(CMDPSTATE* MDPstate, anaSearchStateSpace_t* pSearchStateSpace)
{
    //compute heuristic for search

    if (bforwardsearch) {

#if MEM_CHECK == 1
        //int WasEn = DisableMemCheck();
#endif

        //forward search: heur = distance from state to searchgoal which is Goal anaState
        int retv = environment_->GetGoalHeuristic(MDPstate->StateID);

#if MEM_CHECK == 1
        //if (WasEn)
        //	EnableMemCheck();
#endif

        return retv;

    }
    else {
        //backward search: heur = distance from searchgoal to state
        return environment_->GetStartHeuristic(MDPstate->StateID);
    }
}